

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
nestl::impl::list<int,_nestl::allocator<int>_>::
assign_nothrow<nestl::has_exceptions::exception_ptr_error>
          (list<int,_nestl::allocator<int>_> *this,exception_ptr_error *err,size_type n,
          const_reference val)

{
  bool bVar1;
  allocator<int> local_41;
  undefined1 local_40 [8];
  list<int,_nestl::allocator<int>_> tmp;
  const_reference val_local;
  size_type n_local;
  exception_ptr_error *err_local;
  list<int,_nestl::allocator<int>_> *this_local;
  
  tmp.m_node.m_prev = (list_node_base *)val;
  allocator<int>::allocator(&local_41);
  list((list<int,_nestl::allocator<int>_> *)local_40,&local_41);
  allocator<int>::~allocator(&local_41);
  swap((list<int,_nestl::allocator<int>_> *)local_40,this);
  for (val_local = (const_reference)n; val_local != (const_reference)0x0;
      val_local = (const_reference)((long)val_local + -1)) {
    push_back_nothrow<nestl::has_exceptions::exception_ptr_error>
              (this,err,(value_type_conflict *)tmp.m_node.m_prev);
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar1) break;
  }
  ~list((list<int,_nestl::allocator<int>_> *)local_40);
  return;
}

Assistant:

void
list<T, A>::assign_nothrow(OperationError& err, size_type n, const_reference val) NESTL_NOEXCEPT_SPEC
{
    list tmp; tmp.swap(*this);

    while (n > 0)
    {
        push_back_nothrow(err, val);
        if (err)
        {
            return;
        }

        --n;
    }
}